

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Trigger * sqlite3TriggersExist(Parse *pParse,Table *pTab,int op,ExprList *pChanges,int *pMask)

{
  int iVar1;
  Trigger *pTVar2;
  int *pMask_local;
  ExprList *pChanges_local;
  int op_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  if (((pTab->pTrigger != (Trigger *)0x0) || (iVar1 = tempTriggersExist(pParse->db), iVar1 != 0)) &&
     (pParse->disableTriggers == '\0')) {
    pTVar2 = triggersReallyExist(pParse,pTab,op,pChanges,pMask);
    return pTVar2;
  }
  if (pMask != (int *)0x0) {
    *pMask = 0;
  }
  return (Trigger *)0x0;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggersExist(
  Parse *pParse,          /* Parse context */
  Table *pTab,            /* The table the contains the triggers */
  int op,                 /* one of TK_DELETE, TK_INSERT, TK_UPDATE */
  ExprList *pChanges,     /* Columns that change in an UPDATE statement */
  int *pMask              /* OUT: Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
){
  assert( pTab!=0 );
  if( (pTab->pTrigger==0 && !tempTriggersExist(pParse->db))
   || pParse->disableTriggers
  ){
    if( pMask ) *pMask = 0;
    return 0;
  }
  return triggersReallyExist(pParse,pTab,op,pChanges,pMask);
}